

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O1

void __thiscall VGMPlayer::Cmd_NES_Reg(VGMPlayer *this)

{
  byte bVar1;
  CHIP_DEVICE *pCVar2;
  byte bVar3;
  
  pCVar2 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,
                        this->_fileData[(ulong)this->_filePos + 1] >> 7);
  if ((pCVar2 != (CHIP_DEVICE *)0x0) && (pCVar2->write8 != (DEVFUNC_WRITE_A8D8)0x0)) {
    bVar1 = this->_fileData[(ulong)this->_filePos + 1];
    bVar3 = 0x23;
    if (((bVar1 & 0x7f) != 0x3f) && (bVar3 = bVar1 & 0x7f, (bVar1 & 0x60) == 0x20)) {
      bVar3 = bVar1 & 0x1f | 0x80;
    }
    (*pCVar2->write8)((pCVar2->base).defInf.dataPtr,bVar3,this->_fileData[(ulong)this->_filePos + 2]
                     );
    return;
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_NES_Reg(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = (fData[0x01] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->write8 == NULL)
		return;
	
	UINT8 ofs = fData[0x01] & 0x7F;
	
	// remap FDS registers
	if (ofs == 0x3F)
		ofs = 0x23;	// FDS I/O enable
	else if ((ofs & 0xE0) == 0x20)
		ofs = 0x80 | (ofs & 0x1F);	// FDS register
	
	cDev->write8(cDev->base.defInf.dataPtr, ofs, fData[0x02]);
	return;
}